

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  pointer pSVar1;
  long *plVar2;
  Expr<tcu::Matrix<float,_2,_2>_> *pEVar3;
  IVal *src;
  size_t ndx;
  ulong uVar4;
  long lVar5;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  _Stack_108;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  YesNoMaybe YStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  double local_b8;
  Precision local_b0;
  undefined1 *local_a8;
  int local_a0;
  Matrix<tcu::Interval,_2,_2> local_90;
  
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_108._M_impl.super__Rb_tree_header._M_header;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_108._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_108._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_108._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  initialize(this);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)&_Stack_108,
             (this->m_var0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
             .m_ptr,args->a);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_108,
             (this->m_var1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,args->b);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_108,
             (this->m_var2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,args->c);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,args->d);
  local_b0 = ctx->floatPrecision;
  local_a0 = ctx->callDepth;
  local_b8 = (ctx->format).m_maxValue;
  local_d8 = (ctx->format).m_minExp;
  iStack_d4 = (ctx->format).m_maxExp;
  iStack_d0 = (ctx->format).m_fractionBits;
  YStack_cc = (ctx->format).m_hasSubnormal;
  local_c8._0_4_ = (ctx->format).m_hasInf;
  local_c8._4_4_ = (ctx->format).m_hasNaN;
  uStack_c0 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  lVar5 = 0;
  uVar4 = 0;
  local_a8 = (undefined1 *)&_Stack_108;
  while( true ) {
    pSVar1 = (this->m_body).
             super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->m_body).
                      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1 >> 4) <= uVar4)
    break;
    plVar2 = *(long **)((long)&(pSVar1->
                               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>).
                               m_ptr + lVar5);
    (**(code **)(*plVar2 + 0x18))(plVar2,&local_d8);
    uVar4 = uVar4 + 1;
    lVar5 = lVar5 + 0x10;
  }
  pEVar3 = (this->m_ret).super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_2,_2>_>_>
           .m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(&local_90,pEVar3,&local_d8);
  tcu::Matrix<tcu::Interval,_2,_2>::operator=(__return_storage_ptr__,&local_90);
  src = Environment::lookup<tcu::Matrix<float,2,2>>
                  ((Environment *)&_Stack_108,
                   (this->m_var0).
                   super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                   .m_ptr);
  tcu::Matrix<tcu::Interval,_2,_2>::operator=(args->a,src);
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_108,
             (this->m_var1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr);
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_108,
             (this->m_var2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr);
  Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&_Stack_108,
             (this->m_var3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&_Stack_108);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}